

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_all_guis.c
# Opt level: O2

int iemgui_getcolorarg(int index,int argc,t_atom *argv)

{
  t_symbol *ptVar1;
  long lVar2;
  uint uVar3;
  t_float tVar4;
  
  uVar3 = 0;
  if (index < argc) {
    uVar3 = 0;
    if (argv[(uint)index].a_type == A_SYMBOL) {
      ptVar1 = atom_getsymbolarg(index,argc,argv);
      if (*ptVar1->s_name == '#') {
        lVar2 = strtol(ptVar1->s_name + 1,(char **)0x0,0x10);
        uVar3 = (uint)lVar2 & 0xffffff;
      }
    }
    else if (argv[(uint)index].a_type == A_FLOAT) {
      tVar4 = atom_getfloatarg(index,argc,argv);
      uVar3 = (int)tVar4;
    }
  }
  return uVar3;
}

Assistant:

static int iemgui_getcolorarg(int index, int argc, t_atom*argv)
{
    if(index < 0 || index >= argc)
        return 0;
    if(IS_A_FLOAT(argv,index))
        return atom_getfloatarg(index, argc, argv);
    if(IS_A_SYMBOL(argv,index))
    {
        t_symbol*s=atom_getsymbolarg(index, argc, argv);
        if ('#' == s->s_name[0])
        {
            int col = (int)strtol(s->s_name+1, 0, 16);
            return col & 0xFFFFFF;
        }
    }
    return 0;
}